

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  element_type *peVar1;
  bool bVar2;
  char *__s;
  cmLocalGenerator *pcVar3;
  cmGeneratorTarget *this_00;
  undefined7 in_register_00000009;
  string *this_01;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string val;
  string prop;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  anon_class_16_2_c95d1c49 print_err;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  allocator<char> local_101;
  undefined1 local_100 [40];
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  GenVarsT *local_88;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  local_100._36_4_ = (undefined4)CONCAT71(in_register_00000009,ignoreMissingTarget);
  __return_storage_ptr__ = &local_b8;
  local_98._8_8_ = this;
  local_88 = genVars;
  std::operator+(__return_storage_ptr__,genVars->GenNameUpper,"_EXECUTABLE");
  __s = cmTarget::GetSafeProperty(this->Target->Target,__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,__s,(allocator<char> *)(local_100 + 0x28));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    cmTarget::GetMakefile(this->Target->Target);
    cmMakefile::GetBacktrace((cmMakefile *)(local_80 + 0x10));
    std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               (local_80 + 0x10));
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_80,(cmListFileBacktrace *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_98,(string *)local_80);
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_100 + 0x28),"",&local_101);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_98._0_8_,pcVar3,(string *)(local_100 + 0x28),
               false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_50);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)(local_100 + 0x28));
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_98);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    if ((genVars->Executable)._M_string_length == 0 && local_100[0x24] == '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_100 + 0x28),&local_b8," evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)(local_98 + 8),(string *)(local_100 + 0x28));
      std::__cxx11::string::~string((string *)(local_100 + 0x28));
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      std::make_shared<cmQtAutoGen::CompilerFeatures>();
      std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(genVars->ExecutableFeatures).
                  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_100 + 0x28));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 0x30));
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    }
  }
  bVar4 = (byte)__return_storage_ptr__;
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    if ((this->QtVersion).Major - 4 < 3) {
      std::__cxx11::string::assign((char *)&local_b8);
    }
    std::__cxx11::string::append((string *)&local_b8);
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    this_00 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar3,&local_b8);
    if (this_00 == (cmGeneratorTarget *)0x0) {
      if (local_100[0x24] == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,"Could not find ",(allocator<char> *)(local_100 + 0x28));
        std::__cxx11::string::append((string *)local_100);
        std::__cxx11::string::append(local_100);
        std::__cxx11::string::append((string *)local_100);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)(local_98 + 8),(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        bVar4 = 0;
      }
      else {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(genVars->ExecutableFeatures).
                    super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)
                   local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
        bVar4 = 1;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
      genVars->ExecutableTarget = this_00;
      bVar2 = cmGeneratorTarget::IsImported(this_00);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_100 + 0x28),"",(allocator<char> *)&local_50);
        cmGeneratorTarget::ImportedGetLocation
                  ((string *)local_100,this_00,(string *)(local_100 + 0x28));
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
        this_01 = (string *)(local_100 + 0x28);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,"",(allocator<char> *)(local_100 + 0x28));
        cmGeneratorTarget::GetLocation(this_00,(string *)local_100);
        std::__cxx11::string::assign((char *)&genVars->Executable);
        this_01 = (string *)local_100;
      }
      std::__cxx11::string::~string(this_01);
    }
    std::__cxx11::string::~string((string *)&local_b8);
    if (this_00 != (cmGeneratorTarget *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)local_100,(string *)this->GlobalInitializer,
                 executable,&genVars->Executable);
      std::__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(genVars->ExecutableFeatures).
                  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2> *)
                 local_100);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
      peVar1 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)(local_98 + 8),&local_b8);
        bVar4 = 0;
      }
      std::__cxx11::string::~string((string *)&local_b8);
      bVar4 = bVar4 | peVar1 != (element_type *)0x0;
    }
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}